

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O0

void __thiscall Hpipe::InstructionGraph::make_init(InstructionGraph *this)

{
  _Map_pointer *this_00;
  uint index;
  PendingTrans *pPVar1;
  InstructionSkip *this_01;
  CharItem *pCVar2;
  Instruction *pIVar3;
  size_type sVar4;
  reference ppIVar5;
  bool bVar6;
  value_type local_380;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *local_370;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *local_360;
  Transition local_308;
  value_type local_2e0;
  InstructionRewind *rw_1;
  PendingTrans *pt_1;
  iterator __end2;
  iterator __begin2;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *__range2;
  Instruction *inst;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  loc_pending_trans;
  PendingTrans *pt;
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  *pt_list;
  InstructionRewind *local_218;
  InstructionRewind *rw;
  int local_188;
  undefined1 local_181;
  Context local_180;
  undefined1 local_110 [8];
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  pending_trans_mark;
  undefined1 local_b0 [8];
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  pending_trans;
  deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> pending_rewinds;
  InstructionGraph *this_local;
  
  std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::deque
            ((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> *)
             &pending_trans.
              super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
           *)local_b0);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
           *)local_110);
  this_01 = (InstructionSkip *)operator_new(0x178);
  local_181 = 1;
  pCVar2 = CharGraph::root(this->cg);
  Context::Context(&local_180,pCVar2,1);
  InstructionSkip::Instruction(this_01,&local_180);
  local_181 = 0;
  pIVar3 = &PtrPool<Hpipe::Instruction,32>::operator<<
                      ((PtrPool<Hpipe::Instruction,32> *)&this->inst_pool,this_01)->
            super_Instruction;
  this->init = pIVar3;
  Context::~Context(&local_180);
  local_188 = 0;
  pIVar3 = this->init;
  pCVar2 = CharGraph::root(this->cg);
  Context::forward((PC *)&rw,&pIVar3->cx,pCVar2,(bool)(this->never_ending & 1));
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
  ::emplace_back<Hpipe::Instruction*&,int,std::pair<Hpipe::Context,Hpipe::Vec<unsigned_int>>>
            ((deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
              *)local_b0,&this->init,&local_188,
             (pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)&rw);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair
            ((pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_> *)&rw);
  while( true ) {
    sVar4 = std::
            deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            ::size((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                    *)local_b0);
    bVar6 = true;
    if (sVar4 == 0) {
      sVar4 = std::
              deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
              ::size((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                      *)local_110);
      bVar6 = true;
      if (sVar4 == 0) {
        sVar4 = std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                ::size((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                        *)&pending_trans.
                           super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node);
        bVar6 = sVar4 != 0;
      }
    }
    if (!bVar6) break;
    bVar6 = std::
            deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            ::empty((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                     *)local_b0);
    if ((bVar6) &&
       (bVar6 = std::
                deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                ::empty((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                         *)local_110), bVar6)) {
      while (sVar4 = std::
                     deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                     ::size((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                             *)&pending_trans.
                                super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node), sVar4 != 0) {
        this_00 = &pending_trans.
                   super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node;
        ppIVar5 = std::
                  deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
                  front((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>
                         *)this_00);
        local_218 = *ppIVar5;
        std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
        pop_front((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> *)
                  this_00);
        make_rewind_data(this,local_218);
        pt_list._4_4_ = 0;
        std::
        deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
        ::
        emplace_back<Hpipe::InstructionRewind*&,int,std::pair<Hpipe::Context,Hpipe::Vec<unsigned_int>>&>
                  ((deque<Hpipe::InstructionGraph::PendingTrans,std::allocator<Hpipe::InstructionGraph::PendingTrans>>
                    *)local_b0,&local_218,(int *)((long)&pt_list + 4),&local_218->ncx);
      }
    }
    else {
      sVar4 = std::
              deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
              ::size((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                      *)local_110);
      if (sVar4 == 0) {
        local_360 = (deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                     *)local_b0;
      }
      else {
        local_360 = (deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                     *)local_110;
      }
      loc_pending_trans.
      super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node =
           (_Map_pointer)
           std::
           deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
           ::front(local_360);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               *)&inst);
      pIVar3 = make_transitions(this,(deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                                      *)&inst,
                                (PendingTrans *)
                                loc_pending_trans.
                                super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::begin((iterator *)&__end2._M_node,
              (deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
               *)&inst);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::end((iterator *)&pt_1,
            (deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
             *)&inst);
      while (bVar6 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&pt_1), bVar6) {
        rw_1 = (InstructionRewind *)
               std::
               _Deque_iterator<Hpipe::InstructionGraph::PendingTrans,_Hpipe::InstructionGraph::PendingTrans_&,_Hpipe::InstructionGraph::PendingTrans_*>
               ::operator*((_Deque_iterator<Hpipe::InstructionGraph::PendingTrans,_Hpipe::InstructionGraph::PendingTrans_&,_Hpipe::InstructionGraph::PendingTrans_*>
                            *)&__end2._M_node);
        if ((InstructionMark *)
            (rw_1->super_Instruction).cx.paths_to_mark.
            super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start == (InstructionMark *)0x0) {
          local_370 = (deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                       *)local_b0;
        }
        else {
          local_370 = (deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                       *)local_110;
        }
        std::
        deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
        ::push_back(local_370,(value_type *)rw_1);
        std::
        _Deque_iterator<Hpipe::InstructionGraph::PendingTrans,_Hpipe::InstructionGraph::PendingTrans_&,_Hpipe::InstructionGraph::PendingTrans_*>
        ::operator++((_Deque_iterator<Hpipe::InstructionGraph::PendingTrans,_Hpipe::InstructionGraph::PendingTrans_&,_Hpipe::InstructionGraph::PendingTrans_*>
                      *)&__end2._M_node);
      }
      if (pIVar3 == (Instruction *)0x0) {
        local_380 = (value_type)0x0;
      }
      else {
        local_380 = (value_type)
                    __dynamic_cast(pIVar3,&Instruction::typeinfo,&InstructionRewind::typeinfo,0);
      }
      local_2e0 = local_380;
      if (local_380 != (value_type)0x0) {
        std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::
        push_back((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> *)
                  &pending_trans.
                   super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_2e0);
      }
      pPVar1 = *loc_pending_trans.
                super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      index = *(uint *)(loc_pending_trans.
                        super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node + 1);
      Transition::Transition
                (&local_308,pIVar3,
                 (Vec<unsigned_int> *)
                 (loc_pending_trans.
                  super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node + 0x10),-1.0);
      Vec<Hpipe::Transition>::secure_set((Vec<Hpipe::Transition> *)(pPVar1 + 1),index,&local_308);
      Transition::~Transition(&local_308);
      std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
      emplace_back<Hpipe::Instruction*&,Hpipe::Vec<unsigned_int>&>
                ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar3->prev,
                 (Instruction **)
                 loc_pending_trans.
                 super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,
                 (Vec<unsigned_int> *)
                 (loc_pending_trans.
                  super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node + 0x10));
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::pop_front(local_360);
      std::
      deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
      ::~deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
                *)&inst);
    }
  }
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::~deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            *)local_110);
  std::
  deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
  ::~deque((deque<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
            *)local_b0);
  std::deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_>::~deque
            ((deque<Hpipe::InstructionRewind_*,_std::allocator<Hpipe::InstructionRewind_*>_> *)
             &pending_trans.
              super__Deque_base<Hpipe::InstructionGraph::PendingTrans,_std::allocator<Hpipe::InstructionGraph::PendingTrans>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return;
}

Assistant:

void InstructionGraph::make_init() {
    // as much as possible, we try to move forward without cycles (to avoid miss of possible "free mark")
    std::deque<InstructionRewind *> pending_rewinds;
    std::deque<PendingTrans> pending_trans, pending_trans_mark;
    init = inst_pool << new InstructionSkip( Context( cg->root(), Context::FL_BEG ) );

    // first transition
    pending_trans.emplace_back( init, 0, init->cx.forward( cg->root(), never_ending ) );

    // make all the remaining transitions
    while ( pending_trans.size() || pending_trans_mark.size() || pending_rewinds.size() ) {
        // if only rewinds => make rewind data (exec, ncx, ...) and add the new transitions
        if ( pending_trans.empty() && pending_trans_mark.empty() ) {
            while ( pending_rewinds.size() ) {
                InstructionRewind *rw = pending_rewinds.front();
                pending_rewinds.pop_front();
                make_rewind_data( rw );

                pending_trans.emplace_back( rw, 0, rw->ncx );
            }
            continue;
        }

        //
        std::deque<PendingTrans> &pt_list = pending_trans_mark.size() ? pending_trans_mark : pending_trans;
        PendingTrans &pt = pt_list.front();

        // make instruction with associated new pending transitions
        std::deque<PendingTrans> loc_pending_trans;
        Instruction *inst = make_transitions( loc_pending_trans, pt );
        for( PendingTrans &pt : loc_pending_trans )
            ( pt.cx.mark ? pending_trans_mark : pending_trans ).push_back( std::move( pt ) );
        if ( InstructionRewind *rw = dynamic_cast<InstructionRewind *>( inst ) )
            pending_rewinds.push_back( rw );

        // insert it into the graph
        pt.inst->next.secure_set( pt.num_edge, { inst, pt.rcitem } );
        inst->prev.emplace_back( pt.inst, pt.rcitem );

        //
        pt_list.pop_front();
    }
}